

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMini.c
# Opt level: O0

void Abc_FrameGiaInputMiniAig(Abc_Frame_t *pAbc,void *p)

{
  Gia_Man_t *pGVar1;
  Gia_Man_t *pGia;
  void *p_local;
  Abc_Frame_t *pAbc_local;
  
  if (pAbc == (Abc_Frame_t *)0x0) {
    printf("ABC framework is not initialized by calling Abc_Start()\n");
  }
  Gia_ManStopP(&pAbc->pGiaMiniAig);
  Vec_IntFreeP(&pAbc->vCopyMiniAig);
  pGVar1 = Gia_ManFromMiniAig((Mini_Aig_t *)p,&pAbc->vCopyMiniAig);
  Abc_FrameUpdateGia(pAbc,pGVar1);
  pGVar1 = Gia_ManDup(pGVar1);
  pAbc->pGiaMiniAig = pGVar1;
  return;
}

Assistant:

void Abc_FrameGiaInputMiniAig( Abc_Frame_t * pAbc, void * p )
{
    Gia_Man_t * pGia;
    if ( pAbc == NULL )
        printf( "ABC framework is not initialized by calling Abc_Start()\n" );
    Gia_ManStopP( &pAbc->pGiaMiniAig );
    Vec_IntFreeP( &pAbc->vCopyMiniAig );
    pGia = Gia_ManFromMiniAig( (Mini_Aig_t *)p, &pAbc->vCopyMiniAig );
    Abc_FrameUpdateGia( pAbc, pGia );
    pAbc->pGiaMiniAig = Gia_ManDup( pGia );
//    Gia_ManDelete( pGia );
}